

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_SetNlsRhsFn(ARKodeMem ark_mem,ARKRhsFn nls_fi)

{
  ARKodeMem in_RSI;
  int retval;
  ARKodeARKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_RSI,in_stack_ffffffffffffffe0,
                       (ARKodeARKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (in_RSI == (ARKodeMem)0x0) {
      *(undefined8 *)(in_stack_ffffffffffffffe0 + 0x98) =
           *(undefined8 *)(in_stack_ffffffffffffffe0 + 8);
    }
    else {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0x98) = in_RSI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_SetNlsRhsFn(ARKodeMem ark_mem, ARKRhsFn nls_fi)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  if (nls_fi) { step_mem->nls_fi = nls_fi; }
  else { step_mem->nls_fi = step_mem->fi; }

  return (ARK_SUCCESS);
}